

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O3

void pearants(int step,double *AAA,int hit,double *points_x,double *points_y,double *points_z,
             double dist,double *empty_cubs,int *empty_index)

{
  double dVar1;
  double dVar2;
  double dVar3;
  ulong uVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  int j;
  ulong uVar8;
  int k;
  ulong uVar9;
  
  *empty_index = 0;
  if (0 < step) {
    uVar6 = (ulong)(uint)step;
    uVar4 = 0;
    iVar5 = 0;
    do {
      dVar1 = AAA[uVar4];
      uVar8 = 0;
      do {
        dVar2 = AAA[uVar8];
        uVar9 = 0;
        do {
          if (-1 < hit) {
            uVar7 = 0;
            do {
              if ((((dVar1 <= points_x[uVar7]) && (points_x[uVar7] <= dVar1 + dist)) &&
                  (dVar2 <= points_y[uVar7])) &&
                 (((points_y[uVar7] <= dVar2 + dist && (AAA[uVar9] <= points_z[uVar7])) &&
                  (points_z[uVar7] <= AAA[uVar9] + dist)))) goto LAB_00109c26;
              uVar7 = uVar7 + 1;
            } while (hit + 1 != uVar7);
          }
          empty_cubs[iVar5] = AAA[uVar4];
          empty_cubs[(long)iVar5 + 1] = AAA[uVar8];
          dVar3 = AAA[uVar9];
          *empty_index = iVar5 + 3;
          empty_cubs[(long)iVar5 + 2] = dVar3;
          iVar5 = iVar5 + 3;
LAB_00109c26:
          uVar9 = uVar9 + 1;
        } while (uVar9 != uVar6);
        uVar8 = uVar8 + 1;
      } while (uVar8 != uVar6);
      uVar4 = uVar4 + 1;
    } while (uVar4 != uVar6);
  }
  return;
}

Assistant:

void pearants(int step,double *AAA,int hit,double *points_x,double *points_y,
			  double *points_z,double dist,double *empty_cubs,int &empty_index)
{
	double x,y,z;
	int check;
	empty_index=0;
	for (int i = 0; i < step; i++)
	{
		x=AAA[i];
		for (int j = 0; j < step; j++)
		{
			y=AAA[j];
			for (int k = 0; k < step; k++)
			{
				z=AAA[k];
				check=0;
				for (int m = 0; m <= hit; m++)
				{
					if (points_x[m]>= x &&points_x[m]<= x+dist)
					{
						if (points_y[m]>=y &&points_y[m]<= y+dist)
						{
							if (points_z[m]>=z &&points_z[m]<= z+dist)
							{
								check=1;
								break;
							}

						}

					}

				}
				if (check==0)
				{
					empty_cubs[empty_index++]=AAA[i];
					empty_cubs[empty_index++]=AAA[j];
					empty_cubs[empty_index++]=AAA[k];
				}
			}

		}

	}
}